

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

ExprP<float> __thiscall vkt::shaderexecutor::exprP<float>(shaderexecutor *this,Expr<float> *ptr)

{
  SharedPtrStateBase *extraout_RDX;
  ExprP<float> EVar1;
  SharedPtr<const_vkt::shaderexecutor::Expr<float>_> local_20;
  
  de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::SharedPtr(&local_20,ptr);
  exprP<float>(this,&local_20);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release(&local_20);
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state =
       extraout_RDX;
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_ptr =
       (Expr<float> *)this;
  return (ExprP<float>)
         EVar1.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>;
}

Assistant:

ExprP<T> exprP (const Expr<T>* ptr)
{
	return exprP(SharedPtr<const Expr<T> >(ptr));
}